

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gha.c
# Opt level: O3

int gha_adjust_info_newton_md(float *pcm,gha_info *info,size_t dim,gha_ctx_t ctx)

{
  gha_info *pgVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double __x;
  size_t sVar6;
  undefined4 uVar7;
  undefined8 a;
  gha_ctx_t pgVar8;
  int iVar9;
  ulong uVar10;
  float *pfVar11;
  float *pfVar12;
  size_t sVar13;
  float *pfVar14;
  float *pfVar15;
  size_t sVar16;
  long lVar17;
  void *__s;
  long lVar18;
  size_t sVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  size_t sVar23;
  long lVar24;
  double *x;
  size_t sVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float local_198;
  undefined4 uStack_194;
  double local_180;
  float *local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  float *local_150;
  size_t local_148;
  size_t local_140;
  ulong local_138;
  ulong local_130;
  gha_info *local_128;
  long local_120;
  long local_118;
  float *local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  undefined1 *local_b8;
  size_t local_b0;
  undefined1 local_a8 [16];
  float local_8c;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  long local_70;
  float *local_68;
  ulong local_60;
  float *local_58;
  gha_ctx_t local_50;
  long local_48;
  float *local_40;
  ulong local_38;
  
  local_b0 = dim * 3;
  local_70 = dim * 3 + 1;
  local_120 = dim * 8;
  local_140 = dim * 0x18;
  local_48 = dim * 2;
  local_118 = dim << 4;
  local_148 = local_70 * local_b0 * 8;
  local_138 = local_70 * local_b0 * 8 + 0xf & 0xfffffffffffffff0;
  local_130 = dim * 0x18 + 0xf & 0xfffffffffffffff0;
  local_68 = &info->magnitude;
  local_158 = 0;
  pfVar12 = &local_198;
  local_150 = pcm;
  local_128 = info;
  local_78 = dim;
  local_50 = ctx;
  while( true ) {
    pfVar15 = local_150;
    sVar19 = local_50->size;
    pfVar11 = local_50->tmp_buf;
    *(undefined8 *)((long)pfVar12 + -8) = 0x101a77;
    memcpy(pfVar11,pfVar15,sVar19 << 2);
    sVar19 = local_50->size;
    local_c8 = (float *)((long)pfVar12 + -(sVar19 * dim * 4 + 0xf & 0xfffffffffffffff0));
    sVar13 = local_50->size;
    uVar10 = sVar13 * dim * 4 + 0xf & 0xfffffffffffffff0;
    pfVar11 = (float *)((long)local_c8 - uVar10);
    lVar24 = (long)pfVar11 - uVar10;
    pfVar15 = (float *)(lVar24 - uVar10);
    lVar17 = (long)pfVar15 - uVar10;
    lVar18 = lVar17 - uVar10;
    lVar20 = lVar18 - uVar10;
    lVar21 = lVar20 - uVar10;
    lVar22 = lVar24;
    local_110 = pfVar15;
    local_108 = lVar17;
    local_100 = lVar18;
    local_f8 = lVar20;
    local_f0 = lVar21;
    local_d8 = lVar24;
    local_c0 = pfVar11;
    local_b8 = (undefined1 *)pfVar12;
    if (sVar13 == 0) {
      local_38 = 0;
    }
    else {
      local_160 = sVar13 * 4;
      local_168 = sVar19 * 4;
      local_60 = 0;
      local_e0 = lVar21;
      local_d0 = local_c8;
      local_88 = sVar19;
      local_80 = sVar13;
      local_40 = pfVar15;
      local_38 = sVar13;
      do {
        if (dim != 0) {
          fVar29 = (float)local_60;
          if ((long)local_60 < 1) {
            local_8c = (float)(long)-local_60;
          }
          else {
            local_8c = (float)-local_60;
          }
          lVar22 = 0;
          local_40 = (float *)CONCAT44(local_40._4_4_,fVar29);
          local_38 = local_78;
          pfVar12 = local_d0;
          pfVar14 = local_68;
          local_178 = pfVar11;
          local_170 = lVar24;
          local_e8 = lVar20;
          do {
            local_a8 = ZEXT416((uint)*pfVar14);
            dVar5 = (double)(((gha_info *)(pfVar14 + -2))->frequency * fVar29 + pfVar14[-1]);
            local_180 = dVar5;
            local_58 = pfVar12;
            *(undefined8 *)(lVar21 + -8) = 0x101c63;
            dVar5 = sin(dVar5);
            __x = local_180;
            uStack_194 = (undefined4)((ulong)dVar5 >> 0x20);
            local_198 = (float)dVar5;
            *(undefined8 *)(lVar21 + -8) = 0x101c7b;
            dVar5 = cos(__x);
            pgVar8 = local_50;
            pfVar12 = local_58;
            fVar28 = local_8c;
            lVar26 = local_160;
            lVar20 = local_168;
            lVar24 = local_170;
            pfVar11 = local_178;
            fVar2 = local_198;
            uVar7 = local_a8._0_4_;
            fVar30 = (float)local_a8._0_4_ * local_198;
            local_50->tmp_buf[local_60] = local_50->tmp_buf[local_60] - fVar30;
            fVar27 = (float)dVar5;
            fVar31 = -(float)local_a8._0_4_;
            *local_58 = -local_198;
            fVar29 = local_40._0_4_;
            *(float *)((long)pfVar11 + lVar22) = local_40._0_4_ * fVar31 * fVar27;
            *(float *)(lVar24 + lVar22) = fVar31 * fVar27;
            *(float *)((long)pfVar15 + lVar22) = fVar28 * fVar27;
            *(float *)(lVar17 + lVar22) = -fVar27;
            *(float *)(lVar18 + lVar22) = (float)uVar7 * fVar29 * fVar29 * fVar2;
            *(float *)(local_e8 + lVar22) = (float)uVar7 * fVar29 * fVar2;
            *(float *)(local_e0 + lVar22) = fVar30;
            lVar22 = lVar22 + lVar26;
            pfVar12 = (float *)((long)pfVar12 + lVar20);
            pfVar14 = pfVar14 + 3;
            local_38 = local_38 - 1;
          } while (local_38 != 0);
          local_38 = pgVar8->size;
          lVar20 = local_e8;
          sVar19 = local_88;
          dim = local_78;
          lVar22 = local_d8;
          sVar13 = local_80;
        }
        local_60 = local_60 + 1;
        local_e0 = local_e0 + 4;
        lVar20 = lVar20 + 4;
        lVar18 = lVar18 + 4;
        lVar17 = lVar17 + 4;
        pfVar15 = pfVar15 + 1;
        lVar24 = lVar24 + 4;
        pfVar11 = pfVar11 + 1;
        local_d0 = local_d0 + 1;
      } while (local_60 < local_38);
    }
    sVar6 = local_148;
    __s = (void *)(lVar21 - local_138);
    local_a8._0_8_ = __s;
    *(undefined8 *)((long)__s + -8) = 0x101e0b;
    memset(__s,0,sVar6);
    sVar6 = local_140;
    if (dim != 0) {
      local_80 = sVar13 * 4;
      local_40 = local_c8;
      local_58 = local_c0;
      sVar16 = 0;
      local_88 = sVar19 * 4;
      lVar24 = lVar22;
      do {
        lVar20 = local_a8._0_8_ + sVar16 * local_70 * 8;
        lVar17 = local_a8._0_8_ + (sVar16 + dim) * local_70 * 8;
        lVar18 = local_a8._0_8_ + (local_48 + sVar16) * local_70 * 8;
        sVar25 = 0;
        pfVar12 = local_c8;
        pfVar11 = local_c0;
        sVar23 = dim;
        do {
          dim = sVar23;
          if (local_38 != 0) {
            lVar21 = sVar25 + sVar23;
            lVar26 = sVar25 + local_48;
            uVar10 = 0;
            do {
              fVar29 = local_40[uVar10];
              if (sVar16 == sVar25) {
                *(double *)(lVar20 + sVar25 * 8) =
                     (double)(fVar29 * fVar29) + *(double *)(lVar20 + sVar25 * 8);
                fVar2 = local_50->tmp_buf[uVar10];
                fVar28 = local_58[uVar10];
                *(double *)(lVar20 + lVar21 * 8) =
                     (double)(local_110[uVar10] * fVar2 + fVar29 * fVar28) +
                     *(double *)(lVar20 + lVar21 * 8);
                fVar27 = *(float *)(lVar22 + uVar10 * 4);
                *(double *)(lVar20 + lVar26 * 8) =
                     (double)(*(float *)(local_108 + uVar10 * 4) * fVar2 + fVar29 * fVar27) +
                     *(double *)(lVar20 + lVar26 * 8);
                *(double *)(lVar17 + lVar21 * 8) =
                     (double)(*(float *)(local_100 + uVar10 * 4) * fVar2 + fVar28 * fVar28) +
                     *(double *)(lVar17 + lVar21 * 8);
                *(double *)(lVar17 + lVar26 * 8) =
                     (double)(*(float *)(local_f8 + uVar10 * 4) * fVar2 + fVar28 * fVar27) +
                     *(double *)(lVar17 + lVar26 * 8);
                fVar28 = fVar2 * *(float *)(local_f0 + uVar10 * 4) + fVar27 * fVar27;
              }
              else {
                *(double *)(lVar20 + sVar25 * 8) =
                     (double)(pfVar12[uVar10] * fVar29) + *(double *)(lVar20 + sVar25 * 8);
                fVar2 = pfVar11[uVar10];
                *(double *)(lVar20 + lVar21 * 8) =
                     (double)(fVar29 * fVar2) + *(double *)(lVar20 + lVar21 * 8);
                fVar28 = *(float *)(lVar24 + uVar10 * 4);
                *(double *)(lVar20 + lVar26 * 8) =
                     (double)(fVar29 * fVar28) + *(double *)(lVar20 + lVar26 * 8);
                fVar29 = local_58[uVar10];
                *(double *)(lVar17 + lVar21 * 8) =
                     (double)(fVar2 * fVar29) + *(double *)(lVar17 + lVar21 * 8);
                *(double *)(lVar17 + lVar26 * 8) =
                     (double)(fVar29 * fVar28) + *(double *)(lVar17 + lVar26 * 8);
                fVar28 = fVar28 * *(float *)(lVar22 + uVar10 * 4);
              }
              *(double *)(lVar18 + lVar26 * 8) = (double)fVar28 + *(double *)(lVar18 + lVar26 * 8);
              uVar10 = uVar10 + 1;
              dim = local_78;
            } while (local_38 != uVar10);
          }
          lVar21 = sVar25 + local_48;
          lVar26 = sVar25 + sVar23;
          dVar5 = *(double *)(lVar20 + sVar25 * 8);
          *(double *)(lVar20 + sVar25 * 8) = dVar5 + dVar5;
          dVar5 = *(double *)(lVar20 + lVar26 * 8);
          *(double *)(lVar20 + lVar26 * 8) = dVar5 + dVar5;
          dVar5 = *(double *)(lVar20 + lVar21 * 8);
          *(double *)(lVar20 + lVar21 * 8) = dVar5 + dVar5;
          dVar5 = *(double *)(lVar17 + lVar26 * 8);
          *(double *)(lVar17 + lVar26 * 8) = dVar5 + dVar5;
          dVar5 = *(double *)(lVar17 + lVar21 * 8);
          *(double *)(lVar17 + lVar21 * 8) = dVar5 + dVar5;
          dVar5 = *(double *)(lVar18 + lVar21 * 8);
          *(double *)(lVar18 + lVar21 * 8) = dVar5 + dVar5;
          *(undefined8 *)(lVar20 + lVar26 * 8) = *(undefined8 *)(lVar17 + sVar25 * 8);
          *(undefined8 *)(lVar20 + lVar21 * 8) = *(undefined8 *)(lVar18 + sVar25 * 8);
          *(undefined8 *)(lVar17 + lVar21 * 8) = *(undefined8 *)(lVar18 + lVar26 * 8);
          sVar25 = sVar25 + 1;
          lVar24 = lVar24 + local_80;
          pfVar11 = pfVar11 + sVar13;
          pfVar12 = pfVar12 + sVar19;
          sVar23 = dim;
        } while (sVar25 != dim);
        sVar16 = sVar16 + 1;
        lVar22 = lVar22 + local_80;
        local_58 = local_58 + sVar13;
        local_f0 = local_f0 + local_80;
        local_f8 = local_f8 + local_80;
        local_100 = local_100 + local_80;
        local_108 = local_108 + local_80;
        local_110 = local_110 + sVar13;
        local_40 = local_40 + sVar19;
        lVar24 = local_d8;
      } while (sVar16 != dim);
      lVar24 = local_a8._0_8_ + local_b0 * 8;
      sVar16 = 0;
      pfVar12 = local_c8;
      lVar20 = local_d8;
      pfVar11 = local_c0;
      do {
        if (local_38 == 0) {
          lVar22 = (sVar16 + dim) * local_70;
          lVar17 = (local_48 + sVar16) * local_70;
        }
        else {
          pfVar15 = local_50->tmp_buf;
          lVar22 = (sVar16 + dim) * local_70;
          lVar17 = (local_48 + sVar16) * local_70;
          uVar10 = 0;
          do {
            fVar29 = pfVar15[uVar10];
            *(double *)(lVar24 + sVar16 * local_70 * 8) =
                 (double)(pfVar12[uVar10] * fVar29) + *(double *)(lVar24 + sVar16 * local_70 * 8);
            fVar2 = *(float *)(lVar20 + uVar10 * 4);
            *(double *)(lVar24 + lVar22 * 8) =
                 (double)(pfVar11[uVar10] * fVar29) + *(double *)(lVar24 + lVar22 * 8);
            *(double *)(lVar24 + lVar17 * 8) =
                 (double)(fVar29 * fVar2) + *(double *)(lVar24 + lVar17 * 8);
            uVar10 = uVar10 + 1;
          } while (local_38 != uVar10);
        }
        dVar5 = *(double *)(lVar24 + sVar16 * local_70 * 8);
        *(double *)(lVar24 + sVar16 * local_70 * 8) = dVar5 + dVar5;
        dVar5 = *(double *)(lVar24 + lVar22 * 8);
        *(double *)(lVar24 + lVar22 * 8) = dVar5 + dVar5;
        dVar5 = *(double *)(lVar24 + lVar17 * 8);
        *(double *)(lVar24 + lVar17 * 8) = dVar5 + dVar5;
        sVar16 = sVar16 + 1;
        lVar20 = lVar20 + local_80;
        pfVar11 = pfVar11 + sVar13;
        pfVar12 = pfVar12 + sVar19;
      } while (sVar16 != dim);
    }
    x = (double *)((long)__s - local_130);
    x[-1] = 5.22422543584305e-318;
    memset(x,0,sVar6);
    sVar19 = local_b0;
    a = local_a8._0_8_;
    x[-1] = 5.22433413028513e-318;
    iVar9 = sle_solve((double *)a,sVar19,x);
    if (iVar9 != 0) break;
    if (dim != 0) {
      sVar19 = 0;
      pfVar12 = local_68;
      do {
        *pfVar12 = (float)(x[sVar19] * -0.8 + (double)*pfVar12);
        uVar3 = ((gha_info *)(pfVar12 + -2))->frequency;
        uVar4 = ((gha_info *)(pfVar12 + -2))->phase;
        dVar5 = *(double *)((long)x + sVar19 * 8 + local_118);
        ((gha_info *)(pfVar12 + -2))->frequency =
             (float)(*(double *)((long)x + sVar19 * 8 + local_120) * -0.8 + (double)(float)uVar3);
        ((gha_info *)(pfVar12 + -2))->phase = (float)(dVar5 * -0.8 + (double)(float)uVar4);
        sVar19 = sVar19 + 1;
        pfVar12 = pfVar12 + 3;
        pfVar11 = local_68;
        sVar13 = dim;
      } while (dim != sVar19);
      do {
        fVar29 = *pfVar11;
        if (fVar29 < 0.0) {
          fVar29 = -fVar29;
          *pfVar11 = fVar29;
          pfVar11[-1] = pfVar11[-1] + 3.1415927;
        }
        if (1.0 < fVar29) {
          *pfVar11 = 0.5;
        }
        sVar13 = sVar13 - 1;
        pfVar11 = pfVar11 + 3;
      } while (sVar13 != 0);
      sVar19 = 0;
      do {
        pgVar1 = local_128 + sVar19;
        fVar29 = pgVar1->frequency;
        if (fVar29 < 0.0) {
          fVar29 = -fVar29;
          pgVar1->frequency = fVar29;
          pgVar1->phase = 6.2831855 - pgVar1->phase;
        }
        if (6.2831855 < fVar29) {
          do {
            fVar29 = fVar29 + -6.2831855;
          } while (6.2831855 < fVar29);
          pgVar1->frequency = fVar29;
        }
        if (3.1415927 < fVar29) {
          pgVar1->frequency = 6.2831855 - fVar29;
        }
        sVar19 = sVar19 + 1;
      } while (sVar19 != dim);
      sVar19 = 0;
      do {
        pfVar12 = &local_128[sVar19].phase;
        fVar29 = *pfVar12;
        if (6.2831855 < fVar29) {
          do {
            fVar29 = fVar29 + -6.2831855;
          } while (6.2831855 < fVar29);
          *pfVar12 = fVar29;
        }
        if (fVar29 < 0.0) {
          do {
            fVar29 = fVar29 + 6.2831855;
          } while (fVar29 < 0.0);
          *pfVar12 = fVar29;
        }
        sVar19 = sVar19 + 1;
      } while (sVar19 != dim);
    }
    local_158 = local_158 + 1;
    pfVar12 = (float *)local_b8;
    if (local_158 == 7) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int gha_adjust_info_newton_md(const FLOAT* pcm, struct gha_info* info, size_t dim, gha_ctx_t ctx)
{
	size_t loop;
	size_t i, j, k, n;

	const size_t MAX_LOOPS = 7;

	for (loop = 0; loop < MAX_LOOPS; loop++) {
		memcpy(ctx->tmp_buf, pcm, ctx->size * sizeof(FLOAT));

		// Use VLA for a while
		FLOAT BA[dim][ctx->size];
		FLOAT Bw[dim][ctx->size];
		FLOAT Bp[dim][ctx->size];
		FLOAT BAw[dim][ctx->size];
		FLOAT BAp[dim][ctx->size];
		FLOAT Bww[dim][ctx->size];
		FLOAT Bwp[dim][ctx->size];
		FLOAT Bpp[dim][ctx->size];

		for (n = 0; n < ctx->size; n++) {
			for (k = 0; k < dim; k++) {
				FLOAT Ak = (info+k)->magnitude;
				FLOAT wk = (info+k)->frequency;
				FLOAT pk = (info+k)->phase;
				FLOAT s = sin(wk * n + pk);
				FLOAT c = cos(wk * n + pk);
				ctx->tmp_buf[n] -= Ak * s;

				BA[k][n] = -s;
				Bw[k][n] = -Ak * n * c;
				Bp[k][n] = -Ak * c;

				BAw[k][n] = -n * c;
				BAp[k][n] = -c;
				Bww[k][n] = Ak * n * n * s;
				Bwp[k][n] = Ak * n * s;
				Bpp[k][n] = Ak * s;

			}
		}

		double M[dim * 3][dim * 3 + 1];
		memset(M, '\0', dim * 3 * (dim * 3 + 1) * sizeof(double));
		for (i = 0; i < dim; i++) {
			for (j = 0; j < dim; j++) {
				for (n = 0; n < ctx->size; n++) {
					if (i == j) {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[i][n];
						M[i + dim * 0][j + dim * 1] += ctx->tmp_buf[n] * BAw[i][n] + BA[i][n] * Bw[i][n];
						M[i + dim * 0][j + dim * 2] += ctx->tmp_buf[n] * BAp[i][n] + BA[i][n] * Bp[i][n];

						M[i + dim * 1][j + dim * 1] += ctx->tmp_buf[n] * Bww[i][n] + Bw[i][n] * Bw[i][n];
						M[i + dim * 1][j + dim * 2] += ctx->tmp_buf[n] * Bwp[i][n] + Bw[i][n] * Bp[i][n];

						M[i + dim * 2][j + dim * 2] += ctx->tmp_buf[n] * Bpp[i][n] + Bp[i][n] * Bp[i][n];
					} else {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[j][n];
						M[i + dim * 0][j + dim * 1] += BA[i][n] * Bw[j][n];
						M[i + dim * 0][j + dim * 2] += BA[i][n] * Bp[j][n];

						M[i + dim * 1][j + dim * 1] += Bw[i][n] * Bw[j][n];
						M[i + dim * 1][j + dim * 2] += Bw[i][n] * Bp[j][n];

						M[i + dim * 2][j + dim * 2] += Bp[i][n] * Bp[j][n];
					}
				}
				M[i + dim * 0][j + dim * 0] *= 2;
				M[i + dim * 0][j + dim * 1] *= 2;
				M[i + dim * 0][j + dim * 2] *= 2;

				M[i + dim * 1][j + dim * 1] *= 2;
				M[i + dim * 1][j + dim * 2] *= 2;

				M[i + dim * 2][j + dim * 2] *= 2;


				M[i + dim * 0][j + dim * 1] = M[i + dim * 1][j + dim * 0];
				M[i + dim * 0][j + dim * 2] = M[i + dim * 2][j + dim * 0];
				M[i + dim * 1][j + dim * 2] = M[i + dim * 2][j + dim * 1];
			}
		}

		for (k = 0; k < dim; k++) {
			for (n = 0; n < ctx->size; n++) {
				M[k + dim * 0][dim * 3] += ctx->tmp_buf[n] * BA[k][n];
				M[k + dim * 1][dim * 3] += ctx->tmp_buf[n] * Bw[k][n];
				M[k + dim * 2][dim * 3] += ctx->tmp_buf[n] * Bp[k][n];
			}
			M[k + dim * 0][dim * 3] *= 2;
			M[k + dim * 1][dim * 3] *= 2;
			M[k + dim * 2][dim * 3] *= 2;
		}

		double fx0[dim * 3];
		memset(fx0, '\0', dim * 3 * sizeof(double));
		if(sle_solve(&M[0][0], dim * 3, fx0)) {
			return -1;
		}

		for (k = 0; k < dim; k++) {
			//fprintf(stderr, "delta1: %f\n", fx0[k + dim * 0]);
			//fprintf(stderr, "delta2: %f\n", fx0[k + dim * 1]);
			//fprintf(stderr, "delta3: %f\n", fx0[k + dim * 2]);
			(info+k)->magnitude -= (fx0[k + dim * 0] * 0.8);
			(info+k)->frequency -= (fx0[k + dim * 1] * 0.8);
			(info+k)->phase -=     (fx0[k + dim * 2] * 0.8);
		}

		for (k = 0; k < dim; k++) {
			if ((info+k)->magnitude < 0) {
				(info+k)->magnitude *= -1;
				(info+k)->phase += M_PI;
			}

			if ((info+k)->magnitude > 1) {
				//TODO: ???
				(info+k)->magnitude = 0.5;
			}
		}

		for (k = 0; k < dim; k++) {
			if ((info + k)->frequency < 0) {
				//fprintf(stderr, "negative freq\n");
				(info + k)->frequency *= -1;
				(info + k)->phase = 2 * M_PI - (info + k)->phase;
			}
			while ((info + k)->frequency > M_PI * 2.0) {
				//fprintf(stderr, "freq over\n");
				(info + k)->frequency -= M_PI * 2.0;
			}
			if ((info + k)->frequency > M_PI) {
				//fprintf(stderr, "freq ??\n");
				(info + k)->frequency = 2 * M_PI - (info + k)->frequency;
			}
		}

		for (k = 0; k < dim; k++) {
			while ((info+k)->phase > M_PI * 2.0) {
				(info+k)->phase -= M_PI * 2;
			}
			while ((info + k)->phase < 0) {
				(info+k)->phase += M_PI * 2;
			}
		}
	}
	return 0;
}